

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error TT_Set_Named_Instance(TT_Face face,FT_UInt instance_index)

{
  FT_UInt FVar1;
  FT_String *local_50;
  FT_String *style_name;
  FT_Var_Named_Style *named_style;
  SFNT_Service sfnt;
  FT_Memory memory;
  FT_MM_Var *pFStack_28;
  FT_UInt num_instances;
  FT_MM_Var *mmvar;
  GX_Blend blend;
  FT_Error error;
  FT_UInt instance_index_local;
  TT_Face face_local;
  
  blend._0_4_ = 6;
  blend._4_4_ = instance_index;
  _error = face;
  if ((face->blend != (GX_Blend)0x0) ||
     (blend._0_4_ = TT_Get_MM_Var(face,(FT_MM_Var **)0x0), (int)blend == 0)) {
    mmvar = (FT_MM_Var *)_error->blend;
    pFStack_28 = ((GX_Blend)mmvar)->mmvar;
    memory._4_4_ = (uint)((ulong)(_error->root).style_flags >> 0x10) & 0xffff;
    if (blend._4_4_ <= memory._4_4_) {
      if ((blend._4_4_ == 0) || (pFStack_28->namedstyle == (FT_Var_Named_Style *)0x0)) {
        blend._0_4_ = TT_Set_Var_Design(_error,0,(FT_Fixed *)0x0);
      }
      else {
        sfnt = (SFNT_Service)(_error->root).memory;
        named_style = (FT_Var_Named_Style *)_error->sfnt;
        style_name = (FT_String *)(pFStack_28->namedstyle + ((ulong)blend._4_4_ - 1));
        FVar1 = pFStack_28->namedstyle[(ulong)blend._4_4_ - 1].strid;
        blend._0_4_ = (**(code **)&named_style[0xe].strid)(_error,(short)FVar1,&local_50,FVar1);
        if ((int)blend != 0) {
          return (int)blend;
        }
        ft_mem_free((FT_Memory)sfnt,(_error->root).style_name);
        (_error->root).style_name = (FT_String *)0x0;
        (_error->root).style_name = local_50;
        blend._0_4_ = TT_Set_Var_Design(_error,pFStack_28->num_axis,*(FT_Fixed **)style_name);
        if ((int)blend != 0) {
          return (int)blend;
        }
      }
      (_error->root).face_index = (ulong)(blend._4_4_ << 0x10) | (_error->root).face_index & 0xffffU
      ;
      (_error->root).face_flags = (_error->root).face_flags & 0xffffffffffff7fff;
    }
  }
  return (int)blend;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Set_Named_Instance( TT_Face  face,
                         FT_UInt  instance_index )
  {
    FT_Error    error = FT_ERR( Invalid_Argument );
    GX_Blend    blend;
    FT_MM_Var*  mmvar;

    FT_UInt  num_instances;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    num_instances = (FT_UInt)face->root.style_flags >> 16;

    /* `instance_index' starts with value 1, thus `>' */
    if ( instance_index > num_instances )
      goto Exit;

    if ( instance_index > 0 && mmvar->namedstyle )
    {
      FT_Memory     memory = face->root.memory;
      SFNT_Service  sfnt   = (SFNT_Service)face->sfnt;

      FT_Var_Named_Style*  named_style;
      FT_String*           style_name;


      named_style = mmvar->namedstyle + instance_index - 1;

      error = sfnt->get_name( face,
                              (FT_UShort)named_style->strid,
                              &style_name );
      if ( error )
        goto Exit;

      /* set (or replace) style name */
      FT_FREE( face->root.style_name );
      face->root.style_name = style_name;

      /* finally, select the named instance */
      error = TT_Set_Var_Design( face,
                                 mmvar->num_axis,
                                 named_style->coords );
      if ( error )
        goto Exit;
    }
    else
      error = TT_Set_Var_Design( face, 0, NULL );

    face->root.face_index  = ( instance_index << 16 )             |
                             ( face->root.face_index & 0xFFFFL );
    face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

  Exit:
    return error;
  }